

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O2

void ncnn::conv_im2col_sgemm_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> scale_dequant,
               Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  void *pvVar13;
  int iVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  int u;
  int _w;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  uint _h;
  int _c;
  long lVar30;
  void *pvVar31;
  float *pfVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  float *pfVar43;
  void *pvVar44;
  long lVar45;
  float *pfVar46;
  ulong uVar47;
  void *pvVar48;
  char *pcVar49;
  int i;
  uint uVar50;
  long lVar51;
  float *pfVar52;
  float fVar53;
  float fVar54;
  long local_208;
  int sum0 [4];
  float local_178;
  float local_174;
  Mat kernel_tm;
  Mat bottom_tm;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  Mat bottom_im2row;
  
  iVar36 = bottom_blob->c;
  iVar34 = top_blob->w;
  iVar35 = top_blob->h;
  pvVar44 = _kernel->data;
  pvVar13 = _bias->data;
  _w = iVar36 * kernel_h * kernel_w;
  _h = iVar35 * iVar34;
  iVar39 = bottom_blob->w;
  iVar21 = top_blob->c;
  uVar27 = (ulong)iVar21;
  Mat::Mat(&bottom_im2row,_w,_h,1,
           *(Allocator **)
            (scale_dequant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  pvVar48 = bottom_im2row.data;
  uVar33 = 0;
  if (0 < kernel_w) {
    uVar33 = (ulong)(uint)kernel_w;
  }
  iVar40 = 0;
  if (0 < kernel_h) {
    iVar40 = kernel_h;
  }
  iVar18 = 0;
  if (0 < iVar36) {
    iVar18 = iVar36;
  }
  if (iVar34 < 1) {
    iVar34 = 0;
  }
  iVar14 = 0;
  if (iVar35 < 1) {
    iVar35 = 0;
  }
  iVar42 = 0;
  for (iVar26 = 0; iVar26 != iVar35; iVar26 = iVar26 + 1) {
    iVar19 = iVar14;
    for (iVar25 = 0; iVar25 != iVar34; iVar25 = iVar25 + 1) {
      for (_c = 0; _c != iVar18; _c = _c + 1) {
        Mat::channel(&bottom_tm,bottom_blob,_c);
        pvVar31 = bottom_tm.data;
        Mat::~Mat(&bottom_tm);
        iVar24 = iVar19;
        for (iVar20 = 0; iVar20 != iVar40; iVar20 = iVar20 + 1) {
          for (uVar37 = 0; uVar33 != uVar37; uVar37 = uVar37 + 1) {
            *(undefined1 *)((long)pvVar48 + uVar37 + (long)iVar42) =
                 *(undefined1 *)((long)pvVar31 + (long)(iVar24 + (int)uVar37));
          }
          iVar42 = iVar42 + (int)uVar37;
          iVar24 = iVar24 + iVar39;
        }
      }
      iVar19 = iVar19 + stride_w;
    }
    iVar14 = iVar14 + stride_h * iVar39;
  }
  iVar34 = kernel_h * kernel_w * 4;
  Mat::Mat(&bottom_tm,iVar34,iVar36,((int)_h / 4) * -3 + _h,1,
           *(Allocator **)
            (scale_dequant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  local_208 = 1;
  uVar37 = 0;
  uVar33 = (ulong)(uint)((int)_h >> 2);
  if ((int)_h >> 2 < 1) {
    uVar33 = uVar37;
  }
  lVar41 = 2;
  lVar45 = 3;
  for (uVar47 = 0; sVar17 = bottom_im2row.elemsize, pvVar31 = bottom_im2row.data,
      sVar16 = bottom_tm.cstep, sVar15 = bottom_tm.elemsize, pvVar48 = bottom_tm.data,
      uVar47 != uVar33; uVar47 = uVar47 + 1) {
    lVar22 = (long)bottom_im2row.w;
    kernel_tm.data = (void *)(bottom_tm.cstep * uVar47 * bottom_tm.elemsize + (long)bottom_tm.data);
    kernel_tm.refcount = (int *)0x0;
    kernel_tm.elemsize = bottom_tm.elemsize;
    kernel_tm.elempack = bottom_tm.elempack;
    kernel_tm.allocator = bottom_tm.allocator;
    kernel_tm.dims = 2;
    kernel_tm.w = bottom_tm.w;
    kernel_tm.h = bottom_tm.h;
    kernel_tm.c = 1;
    kernel_tm.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
    Mat::~Mat(&kernel_tm);
    lVar23 = sVar17 * lVar41 * lVar22;
    lVar28 = sVar17 * lVar45 * lVar22;
    lVar51 = sVar16 * sVar15 * uVar47;
    lVar30 = sVar17 * local_208 * lVar22;
    lVar22 = sVar17 * uVar37 * lVar22;
    for (lVar38 = 0; (int)lVar38 + 1 < _w; lVar38 = lVar38 + 2) {
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar22);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 1) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar22 + 1);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 2) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar30);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 3) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar30 + 1);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 4) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar23);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 5) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar23 + 1);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 6) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar28);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 7) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar28 + 1);
    }
    for (; (int)lVar38 < _w; lVar38 = lVar38 + 1) {
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar22);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 1) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar30);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 2) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar23);
      *(undefined1 *)((long)pvVar48 + lVar38 * 4 + lVar51 + 3) =
           *(undefined1 *)((long)pvVar31 + lVar38 + lVar28);
    }
    lVar41 = lVar41 + 4;
    lVar45 = lVar45 + 4;
    local_208 = local_208 + 4;
    uVar37 = uVar37 + 4;
  }
  for (uVar50 = _h & 0xfffffffc; iVar35 = bottom_im2row.w, sVar15 = bottom_im2row.elemsize,
      pvVar48 = bottom_im2row.data, (int)uVar50 < (int)_h; uVar50 = uVar50 + 1) {
    pvVar31 = (void *)((long)((int)uVar50 % 4 + (int)uVar50 / 4) * bottom_tm.cstep *
                       bottom_tm.elemsize + (long)bottom_tm.data);
    kernel_tm.refcount = (int *)0x0;
    kernel_tm.elemsize = bottom_tm.elemsize;
    kernel_tm.elempack = bottom_tm.elempack;
    kernel_tm.allocator = bottom_tm.allocator;
    kernel_tm.dims = 2;
    kernel_tm.w = bottom_tm.w;
    kernel_tm.h = bottom_tm.h;
    kernel_tm.c = 1;
    kernel_tm.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
    kernel_tm.data = pvVar31;
    Mat::~Mat(&kernel_tm);
    lVar41 = (long)(int)(iVar35 * uVar50) * sVar15;
    for (lVar45 = 0; (int)lVar45 + 1 < _w; lVar45 = lVar45 + 2) {
      *(undefined1 *)((long)pvVar31 + lVar45) = *(undefined1 *)((long)pvVar48 + lVar45 + lVar41);
      *(undefined1 *)((long)pvVar31 + lVar45 + 1) =
           *(undefined1 *)((long)pvVar48 + lVar45 + lVar41 + 1);
    }
    for (; (int)lVar45 < _w; lVar45 = lVar45 + 1) {
      *(undefined1 *)((long)pvVar31 + lVar45) = *(undefined1 *)((long)pvVar48 + lVar45 + lVar41);
    }
  }
  Mat::Mat(&kernel_tm,iVar34,iVar36,iVar21 % 4 + iVar21 / 4,1,
           *(Allocator **)
            (scale_dequant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  uVar37 = 0;
  uVar33 = (ulong)(uint)(iVar21 >> 2);
  if (iVar21 >> 2 < 1) {
    uVar33 = uVar37;
  }
  iVar21 = iVar36 * kernel_h * kernel_w;
  iVar34 = iVar21 * 4;
  iVar35 = iVar21 * 3;
  iVar21 = iVar21 * 2;
  iVar39 = _w;
  for (uVar47 = 0; sVar16 = kernel_tm.cstep, sVar15 = kernel_tm.elemsize, pvVar48 = kernel_tm.data,
      uVar47 != uVar33; uVar47 = uVar47 + 1) {
    iVar40 = (int)uVar37;
    sum0._0_8_ = kernel_tm.cstep * uVar47 * kernel_tm.elemsize + (long)kernel_tm.data;
    sum0[2] = 0;
    sum0[3] = 0;
    Mat::~Mat((Mat *)sum0);
    lVar45 = sVar16 * sVar15 * uVar47;
    for (lVar41 = 0; (int)lVar41 + 1 < _w; lVar41 = lVar41 + 2) {
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45) =
           *(undefined1 *)((long)pvVar44 + lVar41 + iVar40);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 1) =
           *(undefined1 *)((long)pvVar44 + lVar41 + (long)iVar40 + 1);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 2) =
           *(undefined1 *)((long)pvVar44 + lVar41 + iVar39);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 3) =
           *(undefined1 *)((long)pvVar44 + lVar41 + (long)iVar39 + 1);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 4) =
           *(undefined1 *)((long)pvVar44 + lVar41 + iVar21);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 5) =
           *(undefined1 *)((long)pvVar44 + lVar41 + (long)iVar21 + 1);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 6) =
           *(undefined1 *)((long)pvVar44 + lVar41 + iVar35);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 7) =
           *(undefined1 *)((long)pvVar44 + lVar41 + (long)iVar35 + 1);
    }
    for (; (int)lVar41 < _w; lVar41 = lVar41 + 1) {
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45) =
           *(undefined1 *)((long)pvVar44 + lVar41 + iVar40);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 1) =
           *(undefined1 *)((long)pvVar44 + lVar41 + iVar39);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 2) =
           *(undefined1 *)((long)pvVar44 + lVar41 + iVar21);
      *(undefined1 *)((long)pvVar48 + lVar41 * 4 + lVar45 + 3) =
           *(undefined1 *)((long)pvVar44 + lVar41 + iVar35);
    }
    uVar37 = (ulong)(uint)(iVar40 + iVar34);
    iVar39 = iVar39 + iVar34;
    iVar21 = iVar21 + iVar34;
    iVar35 = iVar35 + iVar34;
  }
  iVar36 = iVar36 * kernel_h * kernel_w * ((uint)(uVar27 >> 2) & 0x3fffffff) * 4;
  uVar47 = uVar27 & 0xfffffffffffffffc;
  for (uVar37 = uVar47; (long)uVar37 < (long)uVar27; uVar37 = uVar37 + 1) {
    uVar29 = (ulong)(uint)((int)uVar37 >> 0x1f) << 0x20 | uVar37 & 0xffffffff;
    pvVar48 = (void *)((long)((int)((long)uVar29 % 4) + (int)((long)uVar29 / 4)) * kernel_tm.cstep *
                       kernel_tm.elemsize + (long)kernel_tm.data);
    sum0[2] = 0;
    sum0[3] = 0;
    sum0._0_8_ = pvVar48;
    Mat::~Mat((Mat *)sum0);
    for (lVar41 = 0; (int)lVar41 + 1 < _w; lVar41 = lVar41 + 2) {
      *(undefined1 *)((long)pvVar48 + lVar41) = *(undefined1 *)((long)pvVar44 + lVar41 + iVar36);
      *(undefined1 *)((long)pvVar48 + lVar41 + 1) =
           *(undefined1 *)((long)pvVar44 + lVar41 + (long)iVar36 + 1);
    }
    for (; (int)lVar41 < _w; lVar41 = lVar41 + 1) {
      *(undefined1 *)((long)pvVar48 + lVar41) = *(undefined1 *)((long)pvVar44 + lVar41 + iVar36);
    }
    iVar36 = iVar36 + _w;
  }
  for (uVar37 = 0; uVar37 != uVar33; uVar37 = uVar37 + 1) {
    uVar29 = uVar37 * 4;
    if (pvVar13 == (void *)0x0) {
      fVar53 = 0.0;
      local_174 = 0.0;
      fVar54 = 0.0;
      local_178 = 0.0;
    }
    else {
      fVar54 = *(float *)((long)pvVar13 + uVar37 * 0x10);
      local_178 = *(float *)((long)pvVar13 + uVar37 * 0x10 + 4);
      local_174 = *(float *)((long)pvVar13 + uVar37 * 0x10 + 8);
      fVar53 = *(float *)((long)pvVar13 + uVar37 * 0x10 + 0xc);
    }
    lVar41 = *(long *)scale_dequant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
    fVar1 = *(float *)(lVar41 + uVar37 * 0x10);
    fVar2 = *(float *)(lVar41 + (uVar29 | 1) * 4);
    fVar3 = *(float *)(lVar41 + (uVar29 | 2) * 4);
    fVar4 = *(float *)(lVar41 + (uVar29 | 3) * 4);
    uVar50 = (uint)uVar29;
    Mat::channel((Mat *)sum0,top_blob,uVar50);
    pfVar52 = (float *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    Mat::channel((Mat *)sum0,top_blob,uVar50 | 1);
    pfVar43 = (float *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    Mat::channel((Mat *)sum0,top_blob,uVar50 | 2);
    pfVar46 = (float *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    Mat::channel((Mat *)sum0,top_blob,uVar50 | 3);
    pfVar32 = (float *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    for (uVar29 = 0; (long)(uVar29 | 3) < (long)(int)_h; uVar29 = uVar29 + 4) {
      pvVar44 = (void *)((uVar29 >> 2) * bottom_tm.cstep * bottom_tm.elemsize + (long)bottom_tm.data
                        );
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pvVar44;
      Mat::~Mat((Mat *)sum0);
      pcVar49 = (char *)(kernel_tm.cstep * uVar37 * kernel_tm.elemsize + (long)kernel_tm.data);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar49;
      Mat::~Mat((Mat *)sum0);
      sum0[0] = 0;
      sum0[1] = 0;
      sum0[2] = 0;
      sum0[3] = 0;
      sum1[0] = 0;
      sum1[1] = 0;
      sum1[2] = 0;
      sum1[3] = 0;
      sum2[0] = 0;
      sum2[1] = 0;
      sum2[2] = 0;
      sum2[3] = 0;
      sum3[0] = 0;
      sum3[1] = 0;
      sum3[2] = 0;
      sum3[3] = 0;
      for (uVar50 = 0; (int)(uVar50 | 1) < _w; uVar50 = uVar50 + 2) {
        cVar5 = *pcVar49;
        cVar6 = pcVar49[1];
        cVar7 = pcVar49[2];
        cVar8 = pcVar49[3];
        cVar9 = pcVar49[4];
        cVar10 = pcVar49[5];
        cVar11 = pcVar49[6];
        cVar12 = pcVar49[7];
        for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 2) {
          iVar34 = (int)*(char *)((long)pvVar44 + lVar41);
          iVar36 = (int)*(char *)((long)pvVar44 + lVar41 + 1);
          *(int *)((long)sum0 + lVar41 * 2) =
               iVar36 * cVar6 + iVar34 * cVar5 + *(int *)((long)sum0 + lVar41 * 2);
          *(int *)((long)sum1 + lVar41 * 2) =
               cVar8 * iVar36 + cVar7 * iVar34 + *(int *)((long)sum1 + lVar41 * 2);
          *(int *)((long)sum2 + lVar41 * 2) =
               cVar10 * iVar36 + cVar9 * iVar34 + *(int *)((long)sum2 + lVar41 * 2);
          *(int *)((long)sum3 + lVar41 * 2) =
               iVar36 * cVar12 + iVar34 * cVar11 + *(int *)((long)sum3 + lVar41 * 2);
        }
        pcVar49 = pcVar49 + 8;
        pvVar44 = (void *)((long)pvVar44 + 8);
      }
      for (; (int)uVar50 < _w; uVar50 = uVar50 + 1) {
        cVar5 = *pcVar49;
        cVar6 = pcVar49[1];
        cVar7 = pcVar49[2];
        cVar8 = pcVar49[3];
        for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
          iVar36 = (int)*(char *)((long)pvVar44 + lVar41);
          sum0[lVar41] = sum0[lVar41] + iVar36 * cVar5;
          sum1[lVar41] = sum1[lVar41] + cVar6 * iVar36;
          sum2[lVar41] = sum2[lVar41] + cVar7 * iVar36;
          sum3[lVar41] = sum3[lVar41] + iVar36 * cVar8;
        }
        pcVar49 = pcVar49 + 4;
        pvVar44 = (void *)((long)pvVar44 + 4);
      }
      for (lVar41 = 0; lVar41 != 0x10; lVar41 = lVar41 + 4) {
        *(float *)((long)pfVar52 + lVar41) = (float)*(int *)((long)sum0 + lVar41) * fVar1 + fVar54;
        *(float *)((long)pfVar43 + lVar41) =
             (float)*(int *)((long)sum1 + lVar41) * fVar2 + local_178;
        *(float *)((long)pfVar46 + lVar41) =
             (float)*(int *)((long)sum2 + lVar41) * fVar3 + local_174;
        *(float *)((long)pfVar32 + lVar41) = (float)*(int *)((long)sum3 + lVar41) * fVar4 + fVar53;
      }
      pfVar52 = pfVar52 + 4;
      pfVar43 = pfVar43 + 4;
      pfVar46 = pfVar46 + 4;
      pfVar32 = pfVar32 + 4;
    }
    while (pvVar44 = bottom_tm.data, uVar50 = (uint)uVar29, (int)uVar50 < (int)_h) {
      uVar29 = (ulong)((uVar50 & 3) + ((uint)(uVar29 >> 2) & 0x3fffffff));
      lVar22 = bottom_tm.cstep * bottom_tm.elemsize;
      sum0._0_8_ = uVar29 * lVar22 + (long)bottom_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      pvVar48 = kernel_tm.data;
      lVar41 = kernel_tm.cstep * uVar37 * kernel_tm.elemsize;
      pcVar49 = (char *)((long)kernel_tm.data + lVar41);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar49;
      Mat::~Mat((Mat *)sum0);
      lVar22 = lVar22 * uVar29;
      iVar39 = 0;
      iVar35 = 0;
      iVar34 = 0;
      iVar36 = 0;
      for (lVar45 = 0; (int)lVar45 + 1 < _w; lVar45 = lVar45 + 2) {
        iVar21 = (int)*(char *)((long)pvVar44 + lVar45 + lVar22);
        iVar40 = (int)*(char *)((long)pvVar44 + lVar45 + lVar22 + 1);
        iVar39 = pcVar49[1] * iVar40 + *pcVar49 * iVar21 + iVar39;
        iVar35 = pcVar49[3] * iVar40 + pcVar49[2] * iVar21 + iVar35;
        iVar34 = pcVar49[5] * iVar40 + pcVar49[4] * iVar21 + iVar34;
        iVar36 = pcVar49[7] * iVar40 + pcVar49[6] * iVar21 + iVar36;
        pcVar49 = pcVar49 + 8;
      }
      for (; (int)lVar45 < _w; lVar45 = lVar45 + 1) {
        iVar21 = (int)*(char *)((long)pvVar44 + lVar45 + lVar22);
        iVar39 = iVar39 + *(char *)((long)pvVar48 + lVar45 * 4 + lVar41) * iVar21;
        iVar35 = iVar35 + *(char *)((long)pvVar48 + lVar45 * 4 + lVar41 + 1) * iVar21;
        iVar34 = iVar34 + *(char *)((long)pvVar48 + lVar45 * 4 + lVar41 + 2) * iVar21;
        iVar36 = iVar36 + *(char *)((long)pvVar48 + lVar45 * 4 + lVar41 + 3) * iVar21;
      }
      *pfVar52 = (float)iVar39 * fVar1 + fVar54;
      *pfVar43 = (float)iVar35 * fVar2 + local_178;
      *pfVar46 = (float)iVar34 * fVar3 + local_174;
      *pfVar32 = (float)iVar36 * fVar4 + fVar53;
      pfVar52 = pfVar52 + 1;
      pfVar43 = pfVar43 + 1;
      pfVar46 = pfVar46 + 1;
      pfVar32 = pfVar32 + 1;
      uVar29 = (ulong)(uVar50 + 1);
    }
  }
  iVar36 = 0;
  if (0 < _w) {
    iVar36 = _w;
  }
  for (; (long)uVar47 < (long)uVar27; uVar47 = uVar47 + 1) {
    iVar34 = (int)uVar47;
    Mat::channel((Mat *)sum0,top_blob,iVar34);
    pfVar52 = (float *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    if (pvVar13 == (void *)0x0) {
      fVar54 = 0.0;
    }
    else {
      fVar54 = *(float *)((long)pvVar13 + uVar47 * 4);
    }
    fVar53 = *(float *)(*(long *)scale_dequant.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar47 * 4);
    iVar35 = (int)((long)((ulong)(uint)(iVar34 >> 0x1f) << 0x20 | uVar47 & 0xffffffff) / 4);
    lVar41 = (long)(iVar35 * -3 + iVar34);
    for (uVar33 = 0; (long)(uVar33 | 3) < (long)(int)_h; uVar33 = uVar33 + 4) {
      pvVar44 = (void *)((uVar33 >> 2) * bottom_tm.cstep * bottom_tm.elemsize + (long)bottom_tm.data
                        );
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pvVar44;
      Mat::~Mat((Mat *)sum0);
      pcVar49 = (char *)(kernel_tm.cstep * lVar41 * kernel_tm.elemsize + (long)kernel_tm.data);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar49;
      Mat::~Mat((Mat *)sum0);
      sum0[0] = 0;
      sum0[1] = 0;
      sum0[2] = 0;
      sum0[3] = 0;
      for (uVar50 = 0; (int)(uVar50 | 1) < _w; uVar50 = uVar50 + 2) {
        cVar5 = *pcVar49;
        cVar6 = pcVar49[1];
        for (lVar45 = 0; lVar45 != 4; lVar45 = lVar45 + 1) {
          sum0[lVar45] = (int)*(char *)((long)pvVar44 + lVar45 * 2 + 1) * (int)cVar6 +
                         (int)*(char *)((long)pvVar44 + lVar45 * 2) * (int)cVar5 + sum0[lVar45];
        }
        pcVar49 = pcVar49 + 2;
        pvVar44 = (void *)((long)pvVar44 + 8);
      }
      for (; (int)uVar50 < _w; uVar50 = uVar50 + 1) {
        cVar5 = *pcVar49;
        for (lVar45 = 0; lVar45 != 4; lVar45 = lVar45 + 1) {
          sum0[lVar45] = sum0[lVar45] + (int)*(char *)((long)pvVar44 + lVar45) * (int)cVar5;
        }
        pcVar49 = pcVar49 + 1;
        pvVar44 = (void *)((long)pvVar44 + 4);
      }
      for (lVar45 = 0; lVar45 != 4; lVar45 = lVar45 + 1) {
        pfVar52[lVar45] = (float)sum0[lVar45] * fVar53 + fVar54;
      }
      pfVar52 = pfVar52 + 4;
    }
    while (pvVar44 = bottom_tm.data, uVar50 = (uint)uVar33, (int)uVar50 < (int)_h) {
      uVar33 = (ulong)((uVar50 & 3) + ((uint)(uVar33 >> 2) & 0x3fffffff));
      lVar22 = bottom_tm.cstep * bottom_tm.elemsize;
      sum0._0_8_ = uVar33 * lVar22 + (long)bottom_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      sVar16 = kernel_tm.cstep;
      sVar15 = kernel_tm.elemsize;
      pvVar48 = kernel_tm.data;
      sum0._0_8_ = kernel_tm.cstep * lVar41 * kernel_tm.elemsize + (long)kernel_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      iVar39 = 0;
      for (lVar45 = 0; iVar36 != (int)lVar45; lVar45 = lVar45 + 1) {
        iVar39 = iVar39 + (int)*(char *)((long)pvVar44 + lVar45 + lVar22 * uVar33) *
                          (int)*(char *)((long)pvVar48 +
                                        lVar45 + sVar16 * (long)(iVar34 + iVar35 * -3) * sVar15);
      }
      *pfVar52 = (float)iVar39 * fVar53 + fVar54;
      pfVar52 = pfVar52 + 1;
      uVar33 = (ulong)(uVar50 + 1);
    }
  }
  Mat::~Mat(&kernel_tm);
  Mat::~Mat(&bottom_tm);
  Mat::~Mat(&bottom_im2row);
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_dequant0 = scale_dequant[i];
            const float scale_dequant1 = scale_dequant[i+1];
            const float scale_dequant2 = scale_dequant[i+2];
            const float scale_dequant3 = scale_dequant[i+3];

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i+1);
            float* output2 = top_blob.channel(i+2);
            float* output3 = top_blob.channel(i+3);

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = (float)sum0[n] * scale_dequant0 + bias0;
                    output1[n] = (float)sum1[n] * scale_dequant1 + bias1;
                    output2[n] = (float)sum2[n] * scale_dequant2 + bias2;
                    output3[n] = (float)sum3[n] * scale_dequant3 + bias3;
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = (float)sum0 * scale_dequant0 + bias0;
                output1[0] = (float)sum1 * scale_dequant1 + bias1;
                output2[0] = (float)sum2 * scale_dequant2 + bias2;
                output3[0] = (float)sum3 * scale_dequant3 + bias3;

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;
            const float scale_dequant0 = scale_dequant[i];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = (float)sum[n] * scale_dequant0 + bias0;
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = (float)sum * scale_dequant0 + bias0;

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}